

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.cpp
# Opt level: O2

int __thiscall Move::getMoveType(Move *this)

{
  bool bVar1;
  
  if (this->tradedNurse != (NurseSolution *)0x0) {
    return 2;
  }
  bVar1 = Position::positionValid(&this->lastPosition);
  return (int)!bVar1;
}

Assistant:

int Move::getMoveType(){
    //If not nullptr, so it was a trade
    if(tradedNurse != nullptr)
        return 2;
        //if last position is not valid, then nurse was removed
    else if(!lastPosition.positionValid())
        return 1;
        //if not, nurse was added
    else return 0;
}